

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O3

void __thiscall xmrig::Worker::storeStats(Worker *this)

{
  long lVar1;
  
  (this->m_hashCount).super___atomic_base<unsigned_long>._M_i = this->m_count;
  lVar1 = std::chrono::_V2::system_clock::now();
  (this->m_timestamp).super___atomic_base<unsigned_long>._M_i = lVar1 / 1000000;
  return;
}

Assistant:

void xmrig::Worker::storeStats()
{
    m_hashCount.store(m_count, std::memory_order_relaxed);
    m_timestamp.store(Chrono::highResolutionMSecs(), std::memory_order_relaxed);
}